

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

int Lodtalk_parse(yyscan_t scanner,ParserScannerExtraData *extraData)

{
  char *__n;
  char cVar1;
  VMContext *pVVar2;
  ArgumentList *pAVar3;
  LODTALK_LTYPE LVar4;
  uint uVar5;
  int iVar6;
  char *__dest;
  undefined *puVar7;
  Argument *pAVar8;
  long *plVar9;
  MethodAST *pMVar10;
  string *psVar11;
  MessageSendNode *this;
  Oop OVar12;
  LocalDeclaration *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char *pcVar14;
  int iVar15;
  ulong uVar16;
  LODTALK_LTYPE *__dest_00;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar17;
  long lVar18;
  LODTALK_LTYPE *pLVar19;
  double *pdVar20;
  ulong uVar21;
  double *__dest_01;
  bool bVar22;
  LODTALK_LTYPE yylloc;
  LODTALK_STYPE yylval;
  yy_state_t yyssa [200];
  LODTALK_STYPE yyvsa [200];
  LODTALK_LTYPE yylsa [200];
  anon_union_8_4_0eb573b0_for_Oop_0 local_1498;
  long local_1490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1488;
  MethodAST *local_1478;
  undefined4 local_146c;
  ParserScannerExtraData *local_1468;
  Argument *local_1460;
  uint local_1454;
  char *local_1450;
  int local_1444;
  anon_union_8_4_0eb573b0_for_Oop_0 local_1440 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1430;
  ArgumentList *local_1420;
  LODTALK_LTYPE local_1418;
  char *local_1408;
  long local_1400;
  double *local_13f8;
  LODTALK_LTYPE *local_13f0;
  LODTALK_STYPE local_13e8;
  yyscan_t local_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  char local_13c8 [208];
  double local_12f8 [200];
  LODTALK_LTYPE local_cb8 [200];
  
  local_13e8.floatingValue = 0.0;
  local_1418 = Lodtalk_parse::yyloc_default;
  pLVar19 = local_cb8;
  local_cb8[0] = Lodtalk_parse::yyloc_default;
  local_1454 = 0xfffffffe;
  local_1400 = 200;
  local_1450 = local_13c8;
  pdVar20 = local_12f8;
  local_1444 = 0;
  iVar15 = 0;
  pcVar14 = local_1450;
  local_1468 = extraData;
  local_13f8 = pdVar20;
  local_13f0 = pLVar19;
  local_13e0 = scanner;
  do {
    *local_1450 = (char)iVar15;
    __dest = pcVar14;
    if (pcVar14 + local_1400 + -1 <= local_1450) {
      if (local_1400 < 10000) {
        lVar18 = local_1400 * 2;
        if (9999 < lVar18) {
          lVar18 = 10000;
        }
        __dest = (char *)malloc(lVar18 * 0x19 + 0x1e);
        if (__dest != (char *)0x0) {
          local_1450 = local_1450 + -(long)pcVar14;
          __n = local_1450 + 1;
          memcpy(__dest,pcVar14,(size_t)__n);
          uVar21 = lVar18 + 0x1e;
          if (-1 < (long)(lVar18 + 0xfU)) {
            uVar21 = lVar18 + 0xfU;
          }
          __dest_01 = (double *)(__dest + (uVar21 & 0xfffffffffffffff0));
          memcpy(__dest_01,local_13f8,(long)__n * 8);
          uVar21 = lVar18 * 8 + 0xf;
          uVar16 = lVar18 * 8 + 0x1e;
          if (-1 < (long)uVar21) {
            uVar16 = uVar21;
          }
          __dest_00 = (LODTALK_LTYPE *)((uVar16 & 0xfffffffffffffff0) + (long)__dest_01);
          local_1408 = pcVar14;
          local_1400 = lVar18;
          memcpy(__dest_00,local_13f0,(long)__n * 0x10);
          if (local_1408 != local_13c8) {
            free(local_1408);
          }
          if ((long)__n < local_1400) {
            local_1450 = local_1450 + (long)__dest;
            pdVar20 = __dest_01 + (long)(__n + -1);
            pLVar19 = __dest_00 + (long)(__n + -1);
            local_13f8 = __dest_01;
            local_13f0 = __dest_00;
            goto LAB_0014b773;
          }
          iVar15 = 1;
          goto LAB_0014c436;
        }
      }
      local_1468->errorCount = local_1468->errorCount + 1;
      fprintf(_stderr,"%d.%d-%d.%d: %s\n",(ulong)(uint)local_1418.first_line,
              (ulong)(uint)local_1418.first_column,(ulong)(uint)local_1418.last_line,
              (ulong)(uint)local_1418.last_column,"memory exhausted");
      iVar15 = 2;
      __dest = pcVar14;
      goto LAB_0014c429;
    }
LAB_0014b773:
    if (iVar15 == 0x34) {
      iVar15 = 0;
      goto LAB_0014c429;
    }
    cVar1 = yypact[iVar15];
    if (cVar1 != -0x3e) {
      uVar5 = local_1454;
      if (local_1454 == 0xfffffffe) {
        uVar5 = Lodtalk_lex(&local_13e8,&local_1418,local_13e0);
      }
      LVar4 = local_1418;
      if ((int)uVar5 < 1) {
        iVar6 = 0;
        local_1454 = 0;
      }
      else {
        pcVar14 = local_1450;
        if (uVar5 == 0x100) goto LAB_0014c41a;
        iVar6 = 2;
        local_1454 = uVar5;
        if (uVar5 < 0x123) {
          iVar6 = (int)""[uVar5];
        }
      }
      uVar5 = cVar1 + iVar6;
      if ((0x95 < uVar5) || (iVar6 != "\x01\x03\x11\x03\x03B\x0fD\a6\x10"[uVar5]))
      goto LAB_0014b86a;
      iVar15 = (int)"\x0e2=3\x0fUNU\x10K<45M\x11T\x12IQ\x13\x14\x15\x16\x17\x18UO?\x19\x1a\x1b\x1c\x1d\x1eRag7\x05\x06\af\x05\x06\a8@\x05\x06\a9fhA\bZ\t\nEF\x0f\nSG\x10B\nHW2\x113\x12LP\x13\x14\x15\x16\x17\x18XVB\x19\x1a\x1b\x1c\x1d\x1e\x0f\x0e\\c\x10\x01\x02\x03`]\x11^[ib\x13\x14\x15\x16\x17\x18jY"
                    [uVar5];
      if ("\x0e2=3\x0fUNU\x10K<45M\x11T\x12IQ\x13\x14\x15\x16\x17\x18UO?\x19\x1a\x1b\x1c\x1d\x1eRag7\x05\x06\af\x05\x06\a8@\x05\x06\a9fhA\bZ\t\nEF\x0f\nSG\x10B\nHW2\x113\x12LP\x13\x14\x15\x16\x17\x18XVB\x19\x1a\x1b\x1c\x1d\x1e\x0f\x0e\\c\x10\x01\x02\x03`]\x11^[ib\x13\x14\x15\x16\x17\x18jY"
          [uVar5] < '\x01') {
        iVar6 = -iVar15;
        goto LAB_0014b87d;
      }
      bVar22 = local_1444 == 0;
      local_1444 = local_1444 + -1;
      if (bVar22) {
        local_1444 = 0;
      }
      *(LODTALK_STYPE *)(pdVar20 + 1) = local_13e8;
      pLVar19[1].first_line = local_1418.first_line;
      pLVar19[1].first_column = local_1418.first_column;
      pLVar19[1].last_line = local_1418.last_line;
      pLVar19[1].last_column = local_1418.last_column;
      local_1454 = 0xfffffffe;
      local_1418 = LVar4;
      goto LAB_0014c343;
    }
LAB_0014b86a:
    iVar6 = (int)""[iVar15];
    if (""[iVar15] == '\0') {
      pcVar14 = local_1450;
      if (local_1444 == 3) {
        if (local_1454 == 0) goto LAB_0014c424;
      }
      else if (local_1444 == 0) {
        local_1468->errorCount = local_1468->errorCount + 1;
        fprintf(_stderr,"%d.%d-%d.%d: %s\n",(ulong)(uint)local_1418.first_line,
                (ulong)(uint)local_1418.first_column,(ulong)(uint)local_1418.last_line,
                (ulong)(uint)local_1418.last_column,"syntax error");
        pcVar14 = local_1450;
      }
LAB_0014c41a:
      for (; pcVar14 != __dest; pcVar14 = pcVar14 + -1) {
      }
LAB_0014c424:
      iVar15 = 1;
LAB_0014c429:
      if (__dest != local_13c8) {
LAB_0014c436:
        free(__dest);
      }
      return iVar15;
    }
LAB_0014b87d:
    local_1408 = (char *)(long)iVar6;
    lVar18 = (long)local_1408[0x153ce0];
    if (lVar18 == 0) {
      uStack_13d0._0_4_ = pLVar19->last_line;
      uStack_13d0._4_4_ = pLVar19->last_column;
      local_13d8._0_4_ = pLVar19->last_line;
      local_13d8._4_4_ = pLVar19->last_column;
    }
    else {
      local_13d8._0_4_ = pLVar19[1 - lVar18].first_line;
      local_13d8._4_4_ = pLVar19[1 - lVar18].first_column;
      uStack_13d0._0_4_ = pLVar19->last_line;
      uStack_13d0._4_4_ = pLVar19->last_column;
    }
    pMVar10 = (MethodAST *)pdVar20[1 - lVar18];
    switch(iVar6) {
    case 2:
    case 3:
    case 4:
      local_1468->astResult = (Node *)*pdVar20;
    default:
      break;
    case 5:
    case 10:
    case 0xf:
    case 0x18:
    case 0x1f:
    case 0x26:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x33:
    case 0x34:
    case 0x36:
    case 0x4a:
      pMVar10 = (MethodAST *)*pdVar20;
      break;
    case 6:
    case 0x15:
    case 0x21:
    case 0x27:
    case 0x32:
      pMVar10 = (MethodAST *)pdVar20[-1];
      break;
    case 7:
      pMVar10 = (MethodAST *)operator_new(0x28);
      Lodtalk::AST::SequenceNode::SequenceNode((SequenceNode *)pMVar10,(Node *)0x0);
      break;
    case 8:
      pMVar10 = (MethodAST *)operator_new(0x28);
      Lodtalk::AST::SequenceNode::SequenceNode((SequenceNode *)pMVar10,(Node *)*pdVar20);
      break;
    case 9:
    case 0x24:
      pMVar10 = (MethodAST *)pdVar20[-2];
      Lodtalk::AST::SequenceNode::addStatement((SequenceNode *)pMVar10,(Node *)*pdVar20);
      break;
    case 0xb:
      pMVar10 = (MethodAST *)operator_new(0x60);
      readStringValue_abi_cxx11_((string *)local_1440,(char *)pdVar20[-3]);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_1440[0].intValue);
      local_1498.pointer = (uint8_t *)&local_1488;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar13) {
        local_1488._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_1488._8_8_ = plVar9[3];
      }
      else {
        local_1488._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_1498.header = ((ObjectHeader *)*plVar9).header;
      }
      local_1490 = plVar9[1];
      *plVar9 = (long)paVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      Lodtalk::AST::MessageSendNode::MessageSendNode
                ((MessageSendNode *)pMVar10,(string *)&local_1498,(Node *)pdVar20[-4],
                 (Node *)pdVar20[-1]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1498.pointer != &local_1488) {
        operator_delete(local_1498.pointer);
      }
      goto LAB_0014c398;
    case 0xc:
      pMVar10 = (MethodAST *)operator_new(0x60);
      Lodtalk::AST::MethodAST::MethodAST
                (pMVar10,local_1468->context,(MethodHeader *)pdVar20[-2],(PragmaList *)pdVar20[-1],
                 (SequenceNode *)*pdVar20);
      break;
    case 0xd:
      pMVar10 = (MethodAST *)operator_new(0x30);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)*pdVar20);
      Lodtalk::AST::MethodHeader::MethodHeader
                ((MethodHeader *)pMVar10,(string *)&local_1498,(ArgumentList *)0x0);
      goto LAB_0014c298;
    case 0xe:
      local_1478 = (MethodAST *)operator_new(0x30);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)pdVar20[-1]);
      local_1420 = (ArgumentList *)operator_new(0x20);
      local_1460 = (Argument *)operator_new(0x28);
      psVar11 = readStringValue_abi_cxx11_((string *)local_1440,(char *)*pdVar20);
      pAVar3 = local_1420;
      local_146c = (undefined4)CONCAT71((int7)((ulong)psVar11 >> 8),1);
      Lodtalk::AST::Argument::Argument(local_1460,(string *)local_1440);
      Lodtalk::AST::ArgumentList::ArgumentList(pAVar3,local_1460);
      local_146c = 0;
      Lodtalk::AST::MethodHeader::MethodHeader
                ((MethodHeader *)local_1478,(string *)&local_1498,pAVar3);
      goto LAB_0014c0bf;
    case 0x10:
      local_1478 = (MethodAST *)operator_new(0x30);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)pdVar20[-1]);
      local_1420 = (ArgumentList *)operator_new(0x20);
      local_1460 = (Argument *)operator_new(0x28);
      psVar11 = readStringValue_abi_cxx11_((string *)local_1440,(char *)*pdVar20);
      pAVar3 = local_1420;
      local_146c = (undefined4)CONCAT71((int7)((ulong)psVar11 >> 8),1);
      Lodtalk::AST::Argument::Argument(local_1460,(string *)local_1440);
      Lodtalk::AST::ArgumentList::ArgumentList(pAVar3,local_1460);
      local_146c = 0;
      Lodtalk::AST::MethodHeader::MethodHeader
                ((MethodHeader *)local_1478,(string *)&local_1498,pAVar3);
      goto LAB_0014c0bf;
    case 0x11:
      pMVar10 = (MethodAST *)pdVar20[-2];
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)pdVar20[-1]);
      local_1460 = (Argument *)operator_new(0x28);
      local_1478 = pMVar10;
      readStringValue_abi_cxx11_((string *)local_1440,(char *)*pdVar20);
      pAVar8 = local_1460;
      Lodtalk::AST::Argument::Argument(local_1460,(string *)local_1440);
      Lodtalk::AST::MethodHeader::appendSelectorAndArgument
                ((MethodHeader *)local_1478,(string *)&local_1498,pAVar8);
LAB_0014c0bf:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1440[0].pointer != &local_1430) {
        operator_delete(local_1440[0].pointer);
      }
      pMVar10 = local_1478;
      aVar17 = local_1498;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1498.pointer == &local_1488) break;
      goto LAB_0014c2a7;
    case 0x12:
      pMVar10 = (MethodAST *)operator_new(0x20);
      Lodtalk::AST::PragmaList::PragmaList((PragmaList *)pMVar10);
      break;
    case 0x13:
      pMVar10 = (MethodAST *)pdVar20[-1];
      Lodtalk::AST::PragmaList::addPragma((PragmaList *)pMVar10,(PragmaDefinition *)*pdVar20);
      break;
    case 0x14:
      pMVar10 = (MethodAST *)operator_new(0x48);
      pVVar2 = local_1468->context;
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)pdVar20[-1]);
      Lodtalk::AST::PragmaDefinition::PragmaDefinition
                ((PragmaDefinition *)pMVar10,pVVar2,(string *)&local_1498);
      goto LAB_0014c298;
    case 0x16:
      pMVar10 = (MethodAST *)operator_new(0x48);
      local_1490 = 0;
      local_1488._M_allocated_capacity = local_1488._M_allocated_capacity & 0xffffffffffffff00;
      local_1498.pointer = (uint8_t *)&local_1488;
      Lodtalk::AST::PragmaDefinition::PragmaDefinition
                ((PragmaDefinition *)pMVar10,local_1468->context,(string *)&local_1498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1498.pointer != &local_1488) {
        operator_delete(local_1498.pointer);
      }
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)pdVar20[-1]);
      Lodtalk::AST::PragmaDefinition::appendParameter
                ((PragmaDefinition *)pMVar10,(string *)&local_1498,(Node *)*pdVar20);
      goto LAB_0014c298;
    case 0x17:
      pMVar10 = (MethodAST *)pdVar20[-2];
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)pdVar20[-1]);
      Lodtalk::AST::PragmaDefinition::appendParameter
                ((PragmaDefinition *)pMVar10,(string *)&local_1498,(Node *)*pdVar20);
      goto LAB_0014c298;
    case 0x19:
      pMVar10 = (MethodAST *)operator_new(0x28);
      pVVar2 = local_1468->context;
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)*pdVar20);
      OVar12 = Lodtalk::ByteSymbol::fromNative(pVVar2,(string *)&local_1498);
      Lodtalk::AST::LiteralNode::LiteralNode((LiteralNode *)pMVar10,OVar12);
      goto LAB_0014c298;
    case 0x1a:
      pMVar10 = (MethodAST *)operator_new(0x50);
      Lodtalk::AST::BlockExpression::BlockExpression
                ((BlockExpression *)pMVar10,(ArgumentList *)pdVar20[-2],(SequenceNode *)pdVar20[-1])
      ;
      break;
    case 0x1c:
      pMVar10 = (MethodAST *)0x0;
      break;
    case 0x1d:
      local_1478 = (MethodAST *)operator_new(0x20);
      pAVar8 = (Argument *)operator_new(0x28);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)*pdVar20);
      Lodtalk::AST::Argument::Argument(pAVar8,(string *)&local_1498);
      Lodtalk::AST::ArgumentList::ArgumentList((ArgumentList *)local_1478,pAVar8);
      goto LAB_0014c161;
    case 0x1e:
      local_1478 = (MethodAST *)pdVar20[-1];
      pAVar8 = (Argument *)operator_new(0x28);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)*pdVar20);
      Lodtalk::AST::Argument::Argument(pAVar8,(string *)&local_1498);
      Lodtalk::AST::ArgumentList::appendArgument((ArgumentList *)local_1478,pAVar8);
      goto LAB_0014c161;
    case 0x20:
      pMVar10 = (MethodAST *)*pdVar20;
      Lodtalk::AST::SequenceNode::setLocalDeclarations
                ((SequenceNode *)pMVar10,(LocalDeclarations *)pdVar20[-1]);
      break;
    case 0x22:
      local_1478 = (MethodAST *)pdVar20[-1];
      this_00 = (LocalDeclaration *)operator_new(0x28);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)*pdVar20);
      Lodtalk::AST::LocalDeclaration::LocalDeclaration(this_00,(string *)&local_1498);
      Lodtalk::AST::LocalDeclarations::appendLocal((LocalDeclarations *)local_1478,this_00);
      goto LAB_0014c161;
    case 0x23:
      pMVar10 = (MethodAST *)operator_new(0x20);
      Lodtalk::AST::LocalDeclarations::LocalDeclarations((LocalDeclarations *)pMVar10);
      break;
    case 0x25:
      pMVar10 = (MethodAST *)operator_new(0x28);
      Lodtalk::AST::SequenceNode::SequenceNode((SequenceNode *)pMVar10,(Node *)*pdVar20);
      break;
    case 0x28:
      pMVar10 = (MethodAST *)operator_new(0x28);
      Lodtalk::AST::SequenceNode::SequenceNode((SequenceNode *)pMVar10,(Node *)0x0);
      break;
    case 0x2e:
      pMVar10 = (MethodAST *)operator_new(0x18);
      Lodtalk::AST::AssignmentExpression::AssignmentExpression
                ((AssignmentExpression *)pMVar10,(Node *)pdVar20[-2],(Node *)*pdVar20);
      break;
    case 0x35:
      pMVar10 = (MethodAST *)operator_new(0x60);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)*pdVar20);
      Lodtalk::AST::MessageSendNode::MessageSendNode
                ((MessageSendNode *)pMVar10,(string *)&local_1498,(Node *)pdVar20[-1]);
      goto LAB_0014c298;
    case 0x37:
      pMVar10 = (MethodAST *)operator_new(0x60);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)pdVar20[-1]);
      Lodtalk::AST::MessageSendNode::MessageSendNode
                ((MessageSendNode *)pMVar10,(string *)&local_1498,(Node *)pdVar20[-2],
                 (Node *)*pdVar20);
      goto LAB_0014c298;
    case 0x38:
      pMVar10 = (MethodAST *)operator_new(0x60);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)pdVar20[-1]);
      Lodtalk::AST::MessageSendNode::MessageSendNode
                ((MessageSendNode *)pMVar10,(string *)&local_1498,(Node *)0x0,(Node *)*pdVar20);
      goto LAB_0014c298;
    case 0x39:
      pMVar10 = (MethodAST *)pdVar20[-2];
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)pdVar20[-1]);
      Lodtalk::AST::MessageSendNode::appendSelector
                ((MessageSendNode *)pMVar10,(string *)&local_1498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1498.pointer != &local_1488) {
        operator_delete(local_1498.pointer);
      }
      Lodtalk::AST::MessageSendNode::appendArgument((MessageSendNode *)pMVar10,(Node *)*pdVar20);
      break;
    case 0x3a:
      pMVar10 = (MethodAST *)*pdVar20;
      Lodtalk::AST::MessageSendNode::setReceiver((MessageSendNode *)pMVar10,(Node *)pdVar20[-1]);
      break;
    case 0x3b:
      pMVar10 = (MethodAST *)pdVar20[-2];
      Lodtalk::AST::MessageSendNode::appendChained
                ((MessageSendNode *)pMVar10,(MessageSendNode *)*pdVar20);
      break;
    case 0x3c:
      local_1478 = (MethodAST *)pdVar20[-2];
      this = (MessageSendNode *)operator_new(0x60);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)*pdVar20);
      Lodtalk::AST::MessageSendNode::MessageSendNode(this,(string *)&local_1498,(Node *)0x0);
      Lodtalk::AST::MessageSendNode::appendChained((MessageSendNode *)local_1478,this);
LAB_0014c161:
      pMVar10 = local_1478;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1498.pointer != &local_1488) {
        operator_delete(local_1498.pointer);
        pMVar10 = local_1478;
      }
      break;
    case 0x3d:
      pMVar10 = (MethodAST *)operator_new(0x38);
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)*pdVar20);
      Lodtalk::AST::IdentifierExpression::IdentifierExpression
                ((IdentifierExpression *)pMVar10,(string *)&local_1498);
      goto LAB_0014c298;
    case 0x3e:
      pMVar10 = (MethodAST *)operator_new(0x10);
      Lodtalk::AST::ReturnStatement::ReturnStatement((ReturnStatement *)pMVar10,(Node *)*pdVar20);
      break;
    case 0x3f:
      pMVar10 = (MethodAST *)operator_new(8);
      (pMVar10->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)0x0;
      Lodtalk::AST::Node::Node((Node *)pMVar10);
      puVar7 = &Lodtalk::AST::SelfReference::vtable;
      goto LAB_0014c242;
    case 0x40:
      pMVar10 = (MethodAST *)operator_new(8);
      (pMVar10->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)0x0;
      Lodtalk::AST::Node::Node((Node *)pMVar10);
      puVar7 = &Lodtalk::AST::SuperReference::vtable;
      goto LAB_0014c242;
    case 0x41:
      pMVar10 = (MethodAST *)operator_new(0x28);
      Lodtalk::AST::LiteralNode::LiteralNode
                ((LiteralNode *)pMVar10,(ProtoObject *)&Lodtalk::TrueObject);
      break;
    case 0x42:
      pMVar10 = (MethodAST *)operator_new(0x28);
      Lodtalk::AST::LiteralNode::LiteralNode
                ((LiteralNode *)pMVar10,(ProtoObject *)&Lodtalk::FalseObject);
      break;
    case 0x43:
      pMVar10 = (MethodAST *)operator_new(0x28);
      Lodtalk::AST::LiteralNode::LiteralNode
                ((LiteralNode *)pMVar10,(ProtoObject *)&Lodtalk::NilObject);
      break;
    case 0x44:
      pMVar10 = (MethodAST *)operator_new(8);
      (pMVar10->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)0x0;
      Lodtalk::AST::Node::Node((Node *)pMVar10);
      puVar7 = &Lodtalk::AST::ThisContextReference::vtable;
LAB_0014c242:
      (pMVar10->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)(puVar7 + 0x10);
      break;
    case 0x45:
      pMVar10 = (MethodAST *)operator_new(0x28);
      OVar12 = Lodtalk::VMContext::signedInt64ObjectFor(local_1468->context,(long)*(int *)pdVar20);
      Lodtalk::AST::LiteralNode::LiteralNode((LiteralNode *)pMVar10,OVar12);
      break;
    case 0x46:
      pMVar10 = (MethodAST *)operator_new(0x28);
      OVar12 = Lodtalk::VMContext::floatObjectFor(local_1468->context,*pdVar20);
      Lodtalk::AST::LiteralNode::LiteralNode((LiteralNode *)pMVar10,OVar12);
      break;
    case 0x47:
      pMVar10 = (MethodAST *)operator_new(0x28);
      pVVar2 = local_1468->context;
      readStringValue_abi_cxx11_((string *)local_1440,(char *)*pdVar20);
      Lodtalk::ByteString::fromNative
                ((Ref<Lodtalk::ByteString> *)&local_1498,pVVar2,(string *)local_1440);
      Lodtalk::AST::LiteralNode::LiteralNode((LiteralNode *)pMVar10,(Oop)local_1498);
      Lodtalk::OopRef::unregisterSelf((OopRef *)&local_1498);
LAB_0014c398:
      paVar13 = &local_1430;
      aVar17 = local_1440[0];
      goto LAB_0014c2a2;
    case 0x48:
      pMVar10 = (MethodAST *)operator_new(0x28);
      Lodtalk::AST::LiteralNode::LiteralNode
                ((LiteralNode *)pMVar10,(Oop)(long)(*(int *)pdVar20 * 8 + 2));
      break;
    case 0x49:
      pMVar10 = (MethodAST *)operator_new(0x28);
      pVVar2 = local_1468->context;
      readStringValue_abi_cxx11_((string *)&local_1498,(char *)*pdVar20);
      OVar12 = Lodtalk::ByteSymbol::fromNative(pVVar2,(string *)&local_1498);
      Lodtalk::AST::LiteralNode::LiteralNode((LiteralNode *)pMVar10,OVar12);
LAB_0014c298:
      paVar13 = &local_1488;
      aVar17 = local_1498;
LAB_0014c2a2:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)aVar17.pointer != paVar13) {
LAB_0014c2a7:
        operator_delete(aVar17.pointer);
      }
      break;
    case 0x4b:
      pcVar14 = "|";
      goto LAB_0014bddd;
    case 0x4c:
      pcVar14 = "<";
      goto LAB_0014bddd;
    case 0x4d:
      pcVar14 = ">";
LAB_0014bddd:
      pMVar10 = (MethodAST *)strdup(pcVar14);
    }
    pdVar20 = pdVar20 + -lVar18;
    local_1450 = local_1450 + -lVar18;
    pLVar19 = pLVar19 + -lVar18;
    pdVar20[1] = (double)pMVar10;
    pLVar19[1].first_line = (undefined4)local_13d8;
    pLVar19[1].first_column = local_13d8._4_4_;
    pLVar19[1].last_line = (undefined4)uStack_13d0;
    pLVar19[1].last_column = uStack_13d0._4_4_;
    uVar5 = (int)""[(long)local_1408[0x153d30] + 0x2c] + (int)*local_1450;
    if ((uVar5 < 0x96) && ("\x01\x03\x11\x03\x03B\x0fD\a6\x10"[uVar5] == *local_1450)) {
      pcVar14 = "\x0e2=3\x0fUNU\x10K<45M\x11T\x12IQ\x13\x14\x15\x16\x17\x18UO?\x19\x1a\x1b\x1c\x1d\x1eRag7\x05\x06\af\x05\x06\a8@\x05\x06\a9fhA\bZ\t\nEF\x0f\nSG\x10B\nHW2\x113\x12LP\x13\x14\x15\x16\x17\x18XVB\x19\x1a\x1b\x1c\x1d\x1e\x0f\x0e\\c\x10\x01\x02\x03`]\x11^[ib\x13\x14\x15\x16\x17\x18jY"
                + uVar5;
    }
    else {
      pcVar14 = yypgoto + (long)local_1408[0x153d30] + 0xc;
    }
    iVar15 = (int)*pcVar14;
LAB_0014c343:
    pdVar20 = pdVar20 + 1;
    pLVar19 = pLVar19 + 1;
    local_1450 = local_1450 + 1;
    pcVar14 = __dest;
  } while( true );
}

Assistant:

int
yyparse (yyscan_t scanner, ParserScannerExtraData *extraData)
{
/* Lookahead token kind.  */
int yychar;


/* The semantic value of the lookahead symbol.  */
/* Default value used for initialization, for pacifying older GCCs
   or non-GCC compilers.  */
YY_INITIAL_VALUE (static YYSTYPE yyval_default;)
YYSTYPE yylval YY_INITIAL_VALUE (= yyval_default);

/* Location data for the lookahead symbol.  */
static YYLTYPE yyloc_default
# if defined LODTALK_LTYPE_IS_TRIVIAL && LODTALK_LTYPE_IS_TRIVIAL
  = { 1, 1, 1, 1 }
# endif
;
YYLTYPE yylloc = yyloc_default;

    /* Number of syntax errors so far.  */
    int yynerrs = 0;

    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

    /* The location stack: array, bottom, top.  */
    YYLTYPE yylsa[YYINITDEPTH];
    YYLTYPE *yyls = yylsa;
    YYLTYPE *yylsp = yyls;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;
  YYLTYPE yyloc;

  /* The locations where the error started and ended.  */
  YYLTYPE yyerror_range[3];



#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N), yylsp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = LODTALK_EMPTY; /* Cause a token to be read.  */

  yylsp[0] = yylloc;
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;
        YYLTYPE *yyls1 = yyls;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yyls1, yysize * YYSIZEOF (*yylsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
        yyls = yyls1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
        YYSTACK_RELOCATE (yyls_alloc, yyls);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;
      yylsp = yyls + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == LODTALK_EMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex (&yylval, &yylloc, scanner);
    }

  if (yychar <= LODTALK_EOF)
    {
      yychar = LODTALK_EOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == LODTALK_error)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = LODTALK_UNDEF;
      yytoken = YYSYMBOL_YYerror;
      yyerror_range[1] = yylloc;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END
  *++yylsp = yylloc;

  /* Discard the shifted token.  */
  yychar = LODTALK_EMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];

  /* Default location. */
  YYLLOC_DEFAULT (yyloc, (yylsp - yylen), yylen);
  yyerror_range[1] = yyloc;
  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 2: /* top: DO_IT blockContent  */
#line 109 "Parser.y"
                        { extraData->astResult = (yyvsp[0].sequenceNode); }
#line 1389 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 3: /* top: METHOD_DEFINITION method  */
#line 110 "Parser.y"
                              { extraData->astResult = (yyvsp[0].node); }
#line 1395 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 4: /* top: SOURCE_FILE sourceFile  */
#line 111 "Parser.y"
                            { extraData->astResult = (yyvsp[0].sequenceNode); }
#line 1401 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 5: /* sourceFile: sourceFileStatementList  */
#line 114 "Parser.y"
                                    {(yyval.sequenceNode) = (yyvsp[0].sequenceNode); }
#line 1407 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 6: /* sourceFile: sourceFileStatementList DOT  */
#line 115 "Parser.y"
                                        {(yyval.sequenceNode) = (yyvsp[-1].sequenceNode); }
#line 1413 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 7: /* sourceFile: %empty  */
#line 116 "Parser.y"
                                    {(yyval.sequenceNode) = new SequenceNode(); }
#line 1419 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 8: /* sourceFileStatementList: sourceFileStatement  */
#line 119 "Parser.y"
                                                                            {(yyval.sequenceNode) = new SequenceNode((yyvsp[0].node)); }
#line 1425 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 9: /* sourceFileStatementList: sourceFileStatementList DOT sourceFileStatement  */
#line 120 "Parser.y"
                                                                            {
                            (yyval.sequenceNode) = (yyvsp[-2].sequenceNode);
                            (yyval.sequenceNode)->addStatement((yyvsp[0].node));
                       }
#line 1434 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 10: /* sourceFileStatement: statement  */
#line 126 "Parser.y"
                                { (yyval.node) = (yyvsp[0].node); }
#line 1440 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 11: /* sourceFileStatement: unaryMessage IDENTIFIER LBRACKET method RBRACKET  */
#line 127 "Parser.y"
                                                                       { (yyval.node) = new MessageSendNode(readStringValue((yyvsp[-3].stringValue)) + ":", (yyvsp[-4].node), (yyvsp[-1].node)); }
#line 1446 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 12: /* method: methodHeader methodPragmas blockContent  */
#line 130 "Parser.y"
                                                { (yyval.node) = new MethodAST(extraData->context, (yyvsp[-2].methodHeader), (yyvsp[-1].pragmaList), (yyvsp[0].sequenceNode)); }
#line 1452 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 13: /* methodHeader: IDENTIFIER  */
#line 133 "Parser.y"
                                            { (yyval.methodHeader) = new MethodHeader(readStringValue((yyvsp[0].stringValue))); }
#line 1458 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 14: /* methodHeader: binarySelector IDENTIFIER  */
#line 134 "Parser.y"
                                            { (yyval.methodHeader) = new MethodHeader(readStringValue((yyvsp[-1].stringValue)), new ArgumentList(new Argument(readStringValue((yyvsp[0].stringValue))))); }
#line 1464 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 15: /* methodHeader: keywordMethodHeader  */
#line 135 "Parser.y"
                                            { (yyval.methodHeader) = (yyvsp[0].methodHeader); }
#line 1470 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 16: /* keywordMethodHeader: MESSAGE_KEYWORD IDENTIFIER  */
#line 138 "Parser.y"
                                                                        { (yyval.methodHeader) = new MethodHeader(readStringValue((yyvsp[-1].stringValue)), new ArgumentList(new Argument(readStringValue((yyvsp[0].stringValue))))); }
#line 1476 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 17: /* keywordMethodHeader: keywordMethodHeader MESSAGE_KEYWORD IDENTIFIER  */
#line 139 "Parser.y"
                                                                        {
                        (yyval.methodHeader) =  (yyvsp[-2].methodHeader);
                        (yyval.methodHeader)->appendSelectorAndArgument(readStringValue((yyvsp[-1].stringValue)), new Argument(readStringValue((yyvsp[0].stringValue))));
                   }
#line 1485 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 18: /* methodPragmas: %empty  */
#line 145 "Parser.y"
               { (yyval.pragmaList) = new PragmaList(); }
#line 1491 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 19: /* methodPragmas: methodPragmas methodPragma  */
#line 146 "Parser.y"
                                          { (yyval.pragmaList) = (yyvsp[-1].pragmaList); (yyval.pragmaList)->addPragma((yyvsp[0].pragmaDefinition)); }
#line 1497 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 20: /* methodPragma: LT IDENTIFIER GT  */
#line 149 "Parser.y"
                                            { (yyval.pragmaDefinition) = new PragmaDefinition(extraData->context, readStringValue((yyvsp[-1].stringValue))); }
#line 1503 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 21: /* methodPragma: LT keywordPragmaContent GT  */
#line 150 "Parser.y"
                                            { (yyval.pragmaDefinition) = (yyvsp[-1].pragmaDefinition); }
#line 1509 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 22: /* keywordPragmaContent: MESSAGE_KEYWORD pragmaLiteral  */
#line 153 "Parser.y"
                                                                    { (yyval.pragmaDefinition) = new PragmaDefinition(extraData->context); (yyval.pragmaDefinition)->appendParameter(readStringValue((yyvsp[-1].stringValue)), (yyvsp[0].node)); }
#line 1515 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 23: /* keywordPragmaContent: keywordPragmaContent MESSAGE_KEYWORD pragmaLiteral  */
#line 154 "Parser.y"
                                                                 { (yyval.pragmaDefinition) = (yyvsp[-2].pragmaDefinition); (yyval.pragmaDefinition)->appendParameter(readStringValue((yyvsp[-1].stringValue)), (yyvsp[0].node)); }
#line 1521 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 24: /* pragmaLiteral: literal  */
#line 157 "Parser.y"
                        { (yyval.node) = (yyvsp[0].node); }
#line 1527 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 25: /* pragmaLiteral: IDENTIFIER  */
#line 158 "Parser.y"
                          { (yyval.node) = new LiteralNode(ByteSymbol::fromNative(extraData->context, readStringValue((yyvsp[0].stringValue)))); }
#line 1533 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 26: /* block: LBRACKET blockArguments blockContent RBRACKET  */
#line 161 "Parser.y"
                                                      { (yyval.node) = new BlockExpression((yyvsp[-2].argumentList), (yyvsp[-1].sequenceNode)); }
#line 1539 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 28: /* blockArguments: %empty  */
#line 165 "Parser.y"
                { (yyval.argumentList) = nullptr; }
#line 1545 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 29: /* blockArgumentList: BLOCK_ARGUMENT  */
#line 168 "Parser.y"
                                                        { (yyval.argumentList) = new ArgumentList(new Argument(readStringValue((yyvsp[0].stringValue)))); }
#line 1551 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 30: /* blockArgumentList: blockArgumentList BLOCK_ARGUMENT  */
#line 169 "Parser.y"
                                                        {
                    (yyval.argumentList) = (yyvsp[-1].argumentList);
                    (yyval.argumentList)->appendArgument(new Argument(readStringValue((yyvsp[0].stringValue))));
                 }
#line 1560 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 31: /* blockContent: statementList  */
#line 175 "Parser.y"
                            { (yyval.sequenceNode) = (yyvsp[0].sequenceNode); }
#line 1566 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 32: /* blockContent: localDeclarations statementList  */
#line 176 "Parser.y"
                                              {
                (yyval.sequenceNode) = (yyvsp[0].sequenceNode);
                (yyval.sequenceNode)->setLocalDeclarations((yyvsp[-1].localDeclarations));
            }
#line 1575 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 33: /* localDeclarations: VERTICAL_BAR localList VERTICAL_BAR  */
#line 182 "Parser.y"
                                                        { (yyval.localDeclarations) = (yyvsp[-1].localDeclarations); }
#line 1581 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 34: /* localList: localList IDENTIFIER  */
#line 185 "Parser.y"
                                {
            (yyval.localDeclarations) = (yyvsp[-1].localDeclarations);
            (yyval.localDeclarations)->appendLocal(new LocalDeclaration(readStringValue((yyvsp[0].stringValue))));
         }
#line 1590 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 35: /* localList: %empty  */
#line 189 "Parser.y"
            { (yyval.localDeclarations) = new LocalDeclarations(); }
#line 1596 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 36: /* statementListNonEmpty: statementListNonEmpty DOT statement  */
#line 192 "Parser.y"
                                                           {
        (yyval.sequenceNode) = (yyvsp[-2].sequenceNode);
        (yyvsp[-2].sequenceNode)->addStatement((yyvsp[0].node));
    }
#line 1605 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 37: /* statementListNonEmpty: statement  */
#line 196 "Parser.y"
                { (yyval.sequenceNode) = new SequenceNode((yyvsp[0].node));}
#line 1611 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 38: /* statementList: statementListNonEmpty  */
#line 199 "Parser.y"
                                     { (yyval.sequenceNode) = (yyvsp[0].sequenceNode); }
#line 1617 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 39: /* statementList: statementListNonEmpty DOT  */
#line 200 "Parser.y"
                                         { (yyval.sequenceNode) = (yyvsp[-1].sequenceNode); }
#line 1623 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 40: /* statementList: %empty  */
#line 201 "Parser.y"
                                     {(yyval.sequenceNode) = new SequenceNode(); }
#line 1629 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 41: /* statement: expression  */
#line 204 "Parser.y"
                      { (yyval.node) = (yyvsp[0].node); }
#line 1635 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 42: /* statement: returnStatement  */
#line 205 "Parser.y"
                           { (yyval.node) = (yyvsp[0].node); }
#line 1641 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 43: /* expression: assignment  */
#line 208 "Parser.y"
                            { (yyval.node) = (yyvsp[0].node); }
#line 1647 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 44: /* expression: binaryMessage  */
#line 209 "Parser.y"
                            { (yyval.node) = (yyvsp[0].node); }
#line 1653 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 45: /* expression: messageChain  */
#line 210 "Parser.y"
                            { (yyval.node) = (yyvsp[0].messageSendNode); }
#line 1659 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 46: /* assignment: referenceExpression ASSIGNMENT expression  */
#line 213 "Parser.y"
                                                      { (yyval.node) = new AssignmentExpression((yyvsp[-2].node), (yyvsp[0].node)); }
#line 1665 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 47: /* operand: literal  */
#line 216 "Parser.y"
                 { (yyval.node) = (yyvsp[0].node); }
#line 1671 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 48: /* operand: specialIdentifiers  */
#line 217 "Parser.y"
                            { (yyval.node) = (yyvsp[0].node); }
#line 1677 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 49: /* operand: referenceExpression  */
#line 218 "Parser.y"
                             { (yyval.node) = (yyvsp[0].node); }
#line 1683 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 50: /* operand: LPARENT statementList RPARENT  */
#line 219 "Parser.y"
                                       { (yyval.node) = (yyvsp[-1].sequenceNode); }
#line 1689 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 51: /* operand: block  */
#line 220 "Parser.y"
                                       { (yyval.node) = (yyvsp[0].node); }
#line 1695 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 52: /* unaryMessage: operand  */
#line 223 "Parser.y"
                                        { (yyval.node) = (yyvsp[0].node); }
#line 1701 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 53: /* unaryMessage: unaryMessage IDENTIFIER  */
#line 224 "Parser.y"
                                        { (yyval.node) = new MessageSendNode(readStringValue((yyvsp[0].stringValue)), (yyvsp[-1].node)); }
#line 1707 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 54: /* binaryMessage: unaryMessage  */
#line 227 "Parser.y"
                                              { (yyval.node) = (yyvsp[0].node); }
#line 1713 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 55: /* binaryMessage: binaryMessage binarySelector unaryMessage  */
#line 228 "Parser.y"
                                                          { (yyval.node) = new MessageSendNode(readStringValue((yyvsp[-1].stringValue)), (yyvsp[-2].node), (yyvsp[0].node)); }
#line 1719 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 56: /* messageChainElement: MESSAGE_KEYWORD binaryMessage  */
#line 231 "Parser.y"
                                                   { (yyval.messageSendNode) = new MessageSendNode(readStringValue((yyvsp[-1].stringValue)), nullptr, (yyvsp[0].node)); }
#line 1725 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 57: /* messageChainElement: messageChainElement MESSAGE_KEYWORD binaryMessage  */
#line 232 "Parser.y"
                                                                 {
                (yyval.messageSendNode) = (yyvsp[-2].messageSendNode);
                (yyval.messageSendNode)->appendSelector(readStringValue((yyvsp[-1].stringValue)));
                (yyval.messageSendNode)->appendArgument((yyvsp[0].node));
            }
#line 1735 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 58: /* messageChain: binaryMessage messageChainElement  */
#line 239 "Parser.y"
                                                {
                (yyval.messageSendNode) = (yyvsp[0].messageSendNode);
                (yyval.messageSendNode)->setReceiver((yyvsp[-1].node));
            }
#line 1744 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 59: /* messageChain: messageChain SEMICOLON messageChainElement  */
#line 243 "Parser.y"
                                                         {
                (yyval.messageSendNode) = (yyvsp[-2].messageSendNode);
                (yyval.messageSendNode)->appendChained((yyvsp[0].messageSendNode));
            }
#line 1753 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 60: /* messageChain: messageChain SEMICOLON IDENTIFIER  */
#line 247 "Parser.y"
                                                {
                (yyval.messageSendNode) = (yyvsp[-2].messageSendNode);
                (yyval.messageSendNode)->appendChained(new MessageSendNode(readStringValue((yyvsp[0].stringValue)), nullptr));
            }
#line 1762 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 61: /* referenceExpression: IDENTIFIER  */
#line 253 "Parser.y"
                                { (yyval.node) = new IdentifierExpression(readStringValue((yyvsp[0].stringValue))); }
#line 1768 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 62: /* returnStatement: RETURN expression  */
#line 256 "Parser.y"
                                   { (yyval.node) = new ReturnStatement((yyvsp[0].node)); }
#line 1774 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 63: /* specialIdentifiers: KSELF  */
#line 259 "Parser.y"
                                    { (yyval.node) = new SelfReference(); }
#line 1780 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 64: /* specialIdentifiers: KSUPER  */
#line 260 "Parser.y"
                                    { (yyval.node) = new SuperReference(); }
#line 1786 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 65: /* specialIdentifiers: KTRUE  */
#line 261 "Parser.y"
                                    { (yyval.node) = new LiteralNode(&TrueObject); }
#line 1792 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 66: /* specialIdentifiers: KFALSE  */
#line 262 "Parser.y"
                                    { (yyval.node) = new LiteralNode(&FalseObject); }
#line 1798 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 67: /* specialIdentifiers: KNIL  */
#line 263 "Parser.y"
                                    { (yyval.node) = new LiteralNode(&NilObject); }
#line 1804 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 68: /* specialIdentifiers: KTHIS_CONTEXT  */
#line 264 "Parser.y"
                                    { (yyval.node) = new ThisContextReference(); }
#line 1810 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 69: /* literal: INTEGER  */
#line 267 "Parser.y"
                    { (yyval.node) = new LiteralNode(extraData->context->signedInt64ObjectFor((yyvsp[0].integerValue))); }
#line 1816 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 70: /* literal: REAL  */
#line 268 "Parser.y"
                    { (yyval.node) = new LiteralNode(extraData->context->floatObjectFor((yyvsp[0].floatingValue))); }
#line 1822 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 71: /* literal: STRING  */
#line 269 "Parser.y"
                    { (yyval.node) = new LiteralNode(ByteString::fromNative(extraData->context, readStringValue((yyvsp[0].stringValue))).getOop()); }
#line 1828 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 72: /* literal: CHARACTER  */
#line 270 "Parser.y"
                    { (yyval.node) = new LiteralNode(Oop::encodeCharacter((yyvsp[0].integerValue))); }
#line 1834 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 73: /* literal: SYMBOL  */
#line 271 "Parser.y"
                    { (yyval.node) = new LiteralNode(ByteSymbol::fromNative(extraData->context, readStringValue((yyvsp[0].stringValue)))); }
#line 1840 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 74: /* binarySelector: BINARY_SELECTOR  */
#line 274 "Parser.y"
                                { (yyval.stringValue) = (yyvsp[0].stringValue); }
#line 1846 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 75: /* binarySelector: VERTICAL_BAR  */
#line 275 "Parser.y"
                                { (yyval.stringValue) = strdup("|"); }
#line 1852 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 76: /* binarySelector: LT  */
#line 276 "Parser.y"
                                { (yyval.stringValue) = strdup("<"); }
#line 1858 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;

  case 77: /* binarySelector: GT  */
#line 277 "Parser.y"
                                { (yyval.stringValue) = strdup(">"); }
#line 1864 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"
    break;


#line 1868 "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/build_O3/vm/Parser.cpp"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;
  *++yylsp = yyloc;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == LODTALK_EMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      yyerror (&yylloc, scanner, extraData, YY_("syntax error"));
    }

  yyerror_range[1] = yylloc;
  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= LODTALK_EOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == LODTALK_EOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval, &yylloc, scanner, extraData);
          yychar = LODTALK_EMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;

      yyerror_range[1] = *yylsp;
      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp, yylsp, scanner, extraData);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  yyerror_range[2] = yylloc;
  ++yylsp;
  YYLLOC_DEFAULT (*yylsp, yyerror_range, 2);

  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (&yylloc, scanner, extraData, YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != LODTALK_EMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval, &yylloc, scanner, extraData);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp, yylsp, scanner, extraData);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif

  return yyresult;
}